

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

lbool __thiscall Minisat::Solver::search(Solver *this,int nof_conflicts)

{
  int *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint8_t uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  bool bVar15;
  lbool lVar16;
  CRef confl;
  Lit p;
  Clause *c;
  Size *pSVar17;
  uint8_t *puVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  CRef cr;
  int local_ac;
  vec<Minisat::Lit,_int> learnt_clause;
  int backtrack_level;
  ClauseAllocator *local_80;
  Size *local_78;
  vec<unsigned_int,_int> *local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (this->ok == false) {
    __assert_fail("ok",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                  ,0x2c0,"lbool Minisat::Solver::search(int)");
  }
  learnt_clause.data = (Lit *)0x0;
  learnt_clause.sz = 0;
  learnt_clause.cap = 0;
  this->starts = this->starts + 1;
  local_78 = &(this->trail).sz;
  local_80 = &this->ca;
  local_70 = &this->learnts;
  local_ac = 0;
  local_48._8_4_ = (int)DAT_0010d770;
  local_48._0_8_ = DAT_0010d770._8_8_;
  local_48._12_4_ = DAT_0010d770._4_4_;
  do {
    bVar7 = nof_conflicts <= local_ac;
    while( true ) {
      confl = propagate(this);
      if (confl != 0xffffffff) break;
      if (bVar7 && -1 < nof_conflicts) {
LAB_00109ec2:
        dVar9 = progressEstimate(this);
        this->progress_estimate = dVar9;
        cancelUntil(this,0);
        puVar18 = &l_Undef;
        goto LAB_00109f11;
      }
      bVar15 = withinBudget(this);
      if (!bVar15) goto LAB_00109ec2;
      if ((this->trail_lim).sz == 0) {
        bVar15 = simplify(this);
        if (!bVar15) goto LAB_00109f0a;
      }
      if (this->max_learnts <= (double)((this->learnts).sz - (this->trail).sz)) {
        reduceDB(this);
      }
      while (iVar5 = (this->trail_lim).sz, iVar5 < (this->assumptions).sz) {
        p.x = (this->assumptions).data[iVar5].x;
        lVar16 = value(this,p);
        cr = CONCAT31(cr._1_3_,lVar16.value);
        bVar15 = lbool::operator==((lbool *)&cr,l_True);
        if (!bVar15) {
          lVar16 = value(this,p);
          cr = CONCAT31(cr._1_3_,lVar16.value);
          bVar15 = lbool::operator==((lbool *)&cr,l_False);
          if (bVar15) {
            analyzeFinal(this,(Lit)(p.x ^ 1),&this->conflict);
            puVar18 = &l_False.value;
            goto LAB_00109f11;
          }
          if (p.x != -2) goto LAB_00109ca6;
          break;
        }
        newDecisionLevel(this);
      }
      this->decisions = this->decisions + 1;
      p = pickBranchLit(this);
      if (p.x == -2) {
        puVar18 = &l_True.value;
        goto LAB_00109f11;
      }
LAB_00109ca6:
      newDecisionLevel(this);
      uncheckedEnqueue(this,p,0xffffffff);
    }
    this->conflicts = this->conflicts + 1;
    if ((this->trail_lim).sz == 0) {
LAB_00109f0a:
      puVar18 = &l_False.value;
LAB_00109f11:
      uVar4 = *puVar18;
      vec<Minisat::Lit,_int>::~vec(&learnt_clause);
      return (lbool)uVar4;
    }
    if (learnt_clause.data != (Lit *)0x0) {
      learnt_clause._8_8_ = learnt_clause._8_8_ & 0xffffffff00000000;
    }
    analyze(this,confl,&learnt_clause,&backtrack_level);
    iVar5 = local_ac;
    cancelUntil(this,backtrack_level);
    if (learnt_clause.sz == 1) {
      uncheckedEnqueue(this,(Lit)(learnt_clause.data)->x,0xffffffff);
    }
    else {
      cr = ClauseAllocator::alloc(local_80,&learnt_clause,true);
      vec<unsigned_int,_int>::push(local_70,(uint *)&cr);
      attachClause(this,cr);
      c = (Clause *)RegionAllocator<unsigned_int>::operator[](&local_80->ra,cr);
      claBumpActivity(this,c);
      uncheckedEnqueue(this,(Lit)(learnt_clause.data)->x,cr);
    }
    local_ac = iVar5 + 1;
    uVar2 = this->var_decay;
    uVar3 = this->clause_decay;
    auVar19._8_4_ = (int)uVar2;
    auVar19._0_8_ = uVar3;
    auVar19._12_4_ = (int)((ulong)uVar2 >> 0x20);
    auVar19 = divpd(local_48,auVar19);
    dVar9 = this->cla_inc * auVar19._0_8_;
    dVar10 = this->var_inc * auVar19._8_8_;
    auVar8._8_4_ = SUB84(dVar10,0);
    auVar8._0_8_ = dVar9;
    auVar8._12_4_ = (int)((ulong)dVar10 >> 0x20);
    this->cla_inc = dVar9;
    this->var_inc = (double)auVar8._8_8_;
    piVar1 = &this->learntsize_adjust_cnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      auVar20._0_8_ = this->learntsize_inc * this->max_learnts;
      auVar20._8_8_ = this->learntsize_adjust_inc * this->learntsize_adjust_confl;
      this->learntsize_adjust_cnt = (int)auVar20._8_8_;
      this->max_learnts = auVar20._0_8_;
      this->learntsize_adjust_confl = auVar20._8_8_;
      if (0 < this->verbosity) {
        pSVar17 = local_78;
        if ((this->trail_lim).sz != 0) {
          pSVar17 = (this->trail_lim).data;
        }
        uVar11 = this->conflicts;
        uVar12 = this->dec_vars;
        uVar13 = this->num_clauses;
        uVar14 = this->clauses_literals;
        iVar5 = (int)this->num_learnts;
        local_68 = (undefined4)this->learnts_literals;
        uStack_60 = (undefined4)(this->learnts_literals >> 0x20);
        uStack_64 = 0x43300000;
        uStack_5c = 0x45300000;
        iVar6 = *pSVar17;
        local_58 = auVar20;
        dVar9 = progressEstimate(this);
        printf("| %9d | %7d %8d %8d | %8d %8d %6.0f | %6.3f %% |\n",
               SUB84((((double)CONCAT44(uStack_5c,uStack_60) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(uStack_64,local_68) - 4503599627370496.0)) / (double)iVar5,0)
               ,dVar9 * 100.0,(ulong)(uint)uVar11,(ulong)(uint)((int)uVar12 - iVar6),
               (ulong)(uint)uVar13,(ulong)(uint)uVar14,(ulong)(uint)(int)(double)local_58._0_8_,
               iVar5);
      }
    }
  } while( true );
}

Assistant:

lbool Solver::search(int nof_conflicts)
{
    assert(ok);
    int         backtrack_level;
    int         conflictC = 0;
    vec<Lit>    learnt_clause;
    starts++;

    for (;;){
        CRef confl = propagate();
        if (confl != CRef_Undef){
            // CONFLICT
            conflicts++; conflictC++;
            if (decisionLevel() == 0) return l_False;

            learnt_clause.clear();
            analyze(confl, learnt_clause, backtrack_level);
            cancelUntil(backtrack_level);

            if (learnt_clause.size() == 1){
                uncheckedEnqueue(learnt_clause[0]);
            }else{
                CRef cr = ca.alloc(learnt_clause, true);
                learnts.push(cr);
                attachClause(cr);
                claBumpActivity(ca[cr]);
                uncheckedEnqueue(learnt_clause[0], cr);
            }

            varDecayActivity();
            claDecayActivity();

            if (--learntsize_adjust_cnt == 0){
                learntsize_adjust_confl *= learntsize_adjust_inc;
                learntsize_adjust_cnt    = (int)learntsize_adjust_confl;
                max_learnts             *= learntsize_inc;

                if (verbosity >= 1)
                    printf("| %9d | %7d %8d %8d | %8d %8d %6.0f | %6.3f %% |\n", 
                           (int)conflicts, 
                           (int)dec_vars - (trail_lim.size() == 0 ? trail.size() : trail_lim[0]), nClauses(), (int)clauses_literals, 
                           (int)max_learnts, nLearnts(), (double)learnts_literals/nLearnts(), progressEstimate()*100);
            }

        }else{
            // NO CONFLICT
            if ((nof_conflicts >= 0 && conflictC >= nof_conflicts) || !withinBudget()){
                // Reached bound on number of conflicts:
                progress_estimate = progressEstimate();
                cancelUntil(0);
                return l_Undef; }

            // Simplify the set of problem clauses:
            if (decisionLevel() == 0 && !simplify())
                return l_False;

            if (learnts.size()-nAssigns() >= max_learnts)
                // Reduce the set of learnt clauses:
                reduceDB();

            Lit next = lit_Undef;
            while (decisionLevel() < assumptions.size()){
                // Perform user provided assumption:
                Lit p = assumptions[decisionLevel()];
                if (value(p) == l_True){
                    // Dummy decision level:
                    newDecisionLevel();
                }else if (value(p) == l_False){
                    analyzeFinal(~p, conflict);
                    return l_False;
                }else{
                    next = p;
                    break;
                }
            }

            if (next == lit_Undef){
                // New variable decision:
                decisions++;
                next = pickBranchLit();

                if (next == lit_Undef)
                    // Model found:
                    return l_True;
            }

            // Increase decision level and enqueue 'next'
            newDecisionLevel();
            uncheckedEnqueue(next);
        }
    }
}